

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,longdouble kappa,
          longdouble delta)

{
  row_value *prVar1;
  bool bVar2;
  type plVar3;
  type prVar4;
  type args_3;
  bit_array *pbVar5;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar6;
  longdouble lVar7;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar8;
  longdouble in_ST5;
  longdouble repair_3;
  row_value *var_3;
  longdouble repair_2;
  row_value *var_2;
  undefined1 auStack_118 [4];
  int i_2;
  undefined1 auStack_108 [8];
  longdouble repair_1;
  row_value *var_1;
  undefined1 auStack_e8 [4];
  int i_1;
  undefined1 auStack_d8 [8];
  longdouble repair;
  row_value *var;
  undefined1 auStack_b8 [4];
  int i;
  undefined1 auStack_a8 [8];
  longdouble d;
  longdouble old_pi;
  longdouble middle;
  longdouble two;
  longdouble one;
  longdouble delta_local;
  longdouble kappa_local;
  int local_2c;
  int local_28;
  int r_size_local;
  int selected_local;
  int k_local;
  row_value *it_local;
  bit_array *x_local;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  *this_local;
  
  stack0xffffffffffffffb8 = kappa;
  stack0xffffffffffffffa8 = delta;
  register0x00001100 = (longdouble)2.0;
  register0x00001100 = (longdouble)1.5;
  unique0x100007bf = (longdouble)1;
  local_2c = r_size;
  local_28 = selected;
  r_size_local = k;
  _selected_local = it;
  it_local = (row_value *)x;
  x_local = (bit_array *)this;
  plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                     ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                      (this + 0x78),(long)k);
  unique0x00006f00 = *plVar3;
  _auStack_a8 = stack0xffffffffffffffa8 +
                stack0xffffffffffffffb8 / ((longdouble)1 - stack0xffffffffffffffb8);
  if (local_28 < 0) {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                           *)(this + 0x60),0);
    lVar8 = prVar4->value;
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                        (this + 0x78),(long)r_size_local);
    *plVar3 = *plVar3 + (longdouble)0.5 * lVar8;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b8,
               "    selected: {}/{} ({})/2 = pi {}\n");
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                           *)(this + 0x60),0);
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                        (this + 0x78),(long)r_size_local);
    debug_logger<true>::log<int,int,long_double,long_double>
              ((debug_logger<true> *)this,_auStack_b8,&local_28,&local_2c,&prVar4->value,plVar3);
    _auStack_d8 = in_ST0;
    for (var._4_4_ = 0; prVar1 = _selected_local, var._4_4_ != local_2c; var._4_4_ = var._4_4_ + 1)
    {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                             *)(this + 0x60),(long)var._4_4_);
      pbVar5 = (bit_array *)(long)prVar4->id;
      unique0x00004a80 = prVar1 + (long)pbVar5;
      bit_array_impl::unset((bit_array_impl *)it_local,unique0x00004a80->column);
      lVar8 = _auStack_a8;
      plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                          (this + 0x50),(long)stack0xffffffffffffff38->value);
      *plVar3 = *plVar3 - lVar8;
      lVar8 = in_ST5;
      solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
      ::local_compute_reduced_cost<baryonyx::bit_array>
                ((longdouble *)this,
                 (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                  *)(ulong)(uint)stack0xffffffffffffff38->column,(int)it_local,pbVar5);
      if (_auStack_d8 <= (longdouble)0) {
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x50),(long)stack0xffffffffffffff38->value);
        lVar6 = (_auStack_d8 + *plVar3) - _auStack_a8;
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x50),(long)stack0xffffffffffffff38->value);
        *plVar3 = lVar6;
      }
      _auStack_d8 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar8;
    }
  }
  else if (local_28 + 1 < local_2c) {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)local_28);
    lVar8 = prVar4->value;
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)(local_28 + 1));
    lVar6 = prVar4->value;
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                        (this + 0x78),(long)r_size_local);
    *plVar3 = *plVar3 + (longdouble)0.5 * (lVar6 + lVar8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_118,
               "    selected: {}/{} ({}x{})/2 = pi {}\n");
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)local_28);
    args_3 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)(local_28 + 1));
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                        (this + 0x78),(long)r_size_local);
    debug_logger<true>::log<int,int,long_double,long_double,long_double>
              ((debug_logger<true> *)this,_auStack_118,&local_28,&local_2c,&prVar4->value,
               &args_3->value,plVar3);
    for (var_2._4_4_ = 0; prVar1 = _selected_local, var_2._4_4_ <= local_28;
        var_2._4_4_ = var_2._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                             *)(this + 0x60),(long)var_2._4_4_);
      pbVar5 = (bit_array *)(long)prVar4->id;
      prVar1 = prVar1 + (long)pbVar5;
      bit_array_impl::set((bit_array_impl *)it_local,prVar1->column);
      lVar8 = _auStack_a8;
      plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                          (this + 0x50),(long)prVar1->value);
      *plVar3 = *plVar3 + lVar8;
      lVar8 = in_ST5;
      solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
      ::local_compute_reduced_cost<baryonyx::bit_array>
                ((longdouble *)this,
                 (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                  *)(ulong)(uint)prVar1->column,(int)it_local,pbVar5);
      if ((longdouble)0 <= in_ST0) {
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x50),(long)prVar1->value);
        lVar6 = _auStack_a8 + (*plVar3 - in_ST0);
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x50),(long)prVar1->value);
        *plVar3 = lVar6;
      }
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar8;
    }
    for (; prVar1 = _selected_local, var_2._4_4_ != local_2c; var_2._4_4_ = var_2._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                             *)(this + 0x60),(long)var_2._4_4_);
      pbVar5 = (bit_array *)(long)prVar4->id;
      prVar1 = prVar1 + (long)pbVar5;
      bit_array_impl::unset((bit_array_impl *)it_local,prVar1->column);
      lVar8 = _auStack_a8;
      plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                          (this + 0x50),(long)prVar1->value);
      *plVar3 = *plVar3 - lVar8;
      lVar8 = in_ST5;
      solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
      ::local_compute_reduced_cost<baryonyx::bit_array>
                ((longdouble *)this,
                 (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                  *)(ulong)(uint)prVar1->column,(int)it_local,pbVar5);
      if (in_ST0 <= (longdouble)0) {
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x50),(long)prVar1->value);
        lVar6 = (in_ST0 + *plVar3) - _auStack_a8;
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x50),(long)prVar1->value);
        *plVar3 = lVar6;
      }
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar8;
    }
  }
  else {
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)local_28);
    lVar8 = prVar4->value;
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                        (this + 0x78),(long)r_size_local);
    *plVar3 = *plVar3 + (longdouble)1.5 * lVar8;
    lVar8 = in_ST4;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8,
               "    selected: {}/{} ({})/2 = pi {}\n");
    prVar4 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)local_28);
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                        (this + 0x78),(long)r_size_local);
    debug_logger<true>::log<int,int,long_double,long_double>
              ((debug_logger<true> *)this,_auStack_e8,&local_28,&local_2c,&prVar4->value,plVar3);
    _auStack_108 = in_ST0;
    for (var_1._4_4_ = 0; prVar1 = _selected_local, var_1._4_4_ != local_2c;
        var_1._4_4_ = var_1._4_4_ + 1) {
      prVar4 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                             *)(this + 0x60),(long)var_1._4_4_);
      pbVar5 = (bit_array *)(long)prVar4->id;
      unique0x00004a80 = prVar1 + (long)pbVar5;
      bit_array_impl::set((bit_array_impl *)it_local,unique0x00004a80->column);
      lVar6 = _auStack_a8;
      plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                          (this + 0x50),(long)stack0xffffffffffffff08->value);
      *plVar3 = *plVar3 + lVar6;
      lVar6 = lVar8;
      solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
      ::local_compute_reduced_cost<baryonyx::bit_array>
                ((longdouble *)this,
                 (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                  *)(ulong)(uint)stack0xffffffffffffff08->column,(int)it_local,pbVar5);
      if ((longdouble)0 <= _auStack_108) {
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x50),(long)stack0xffffffffffffff08->value);
        lVar7 = _auStack_a8 + (*plVar3 - _auStack_108);
        plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                           ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                            (this + 0x50),(long)stack0xffffffffffffff08->value);
        *plVar3 = lVar7;
      }
      _auStack_108 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = lVar8;
      lVar8 = lVar6;
    }
  }
  bVar2 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                      *)this,r_size_local,(bit_array *)it_local);
  lVar8 = stack0xffffffffffffff68;
  if (bVar2) {
    plVar3 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                        (this + 0x78),(long)r_size_local);
    bVar2 = is_signbit_change<long_double>(lVar8,*plVar3);
    return bVar2;
  }
  details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-Z.cpp"
                     ,"436");
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }